

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::VarintCasesWithSizes_ReadVarint64_Test::
VarintCasesWithSizes_ReadVarint64_Test(VarintCasesWithSizes_ReadVarint64_Test *this)

{
  VarintCasesWithSizes_ReadVarint64_Test *this_local;
  
  VarintCasesWithSizes::VarintCasesWithSizes(&this->super_VarintCasesWithSizes);
  (this->super_VarintCasesWithSizes).super_CodedStreamTest.super_Test._vptr_Test =
       (_func_int **)&PTR__VarintCasesWithSizes_ReadVarint64_Test_02a14210;
  (this->super_VarintCasesWithSizes).
  super_WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&DAT_02a14250;
  return;
}

Assistant:

TEST_P(VarintCasesWithSizes, ReadVarint64) {
  const VarintCase& kVarintCases_case = std::get<0>(GetParam());
  const int& kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kVarintCases_case.bytes, kVarintCases_case.size);
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    uint64_t value;
    EXPECT_TRUE(coded_input.ReadVarint64(&value));
    EXPECT_EQ(kVarintCases_case.value, value);
  }

  EXPECT_EQ(kVarintCases_case.size, input.ByteCount());
}